

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O1

nva_card * nva_init_gpu(pci_device *dev)

{
  int iVar1;
  nva_card *pnVar2;
  pci_io_handle *ppVar3;
  size_t sVar4;
  pciaddr_t pVar5;
  uint uVar6;
  uint uVar7;
  
  pnVar2 = (nva_card *)calloc(0x90,1);
  if (pnVar2 == (nva_card *)0x0) {
    return (nva_card *)0x0;
  }
  pnVar2->type = NVA_DEVICE_GPU;
  pnVar2->bus_type = NVA_BUS_PCI;
  (pnVar2->bus).pci = dev;
  iVar1 = pci_device_map_range(dev,dev->regions[0].base_addr,dev->regions[0].size,1,&pnVar2->bar0);
  if (iVar1 != 0) {
    nva_init_gpu_cold_1();
    return (nva_card *)0x0;
  }
  pnVar2->bar0len = dev->regions[0].size;
  sVar4 = dev->regions[1].size;
  if (sVar4 != 0) {
    pnVar2->hasbar1 = 1;
    pnVar2->bar1len = sVar4;
    iVar1 = pci_device_map_range(dev,dev->regions[1].base_addr,sVar4,1,&pnVar2->bar1);
    if (iVar1 != 0) {
      pnVar2->bar1 = (void *)0x0;
    }
  }
  sVar4 = dev->regions[2].size;
  if ((sVar4 == 0) || ((dev->regions[2].field_0x20 & 1) != 0)) {
    sVar4 = dev->regions[3].size;
    if (sVar4 == 0) goto LAB_0010283d;
    pnVar2->hasbar2 = 1;
    pnVar2->bar2len = sVar4;
    pVar5 = dev->regions[3].base_addr;
  }
  else {
    pnVar2->hasbar2 = 1;
    pnVar2->bar2len = sVar4;
    pVar5 = dev->regions[2].base_addr;
  }
  iVar1 = pci_device_map_range(dev,pVar5,sVar4,1,&pnVar2->bar2);
  if (iVar1 != 0) {
    pnVar2->bar2 = (void *)0x0;
  }
LAB_0010283d:
  pci_device_map_legacy(dev,0,0x100000,1,&pnVar2->rawmem);
  ppVar3 = (pci_io_handle *)pci_legacy_open_io(dev,0,0x10000);
  pnVar2->rawio = ppVar3;
  if (dev->regions[2].size == 0) {
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = -(uint)((dev->regions[2].field_0x20 & 1) == 0) | 2;
  }
  uVar7 = uVar6;
  if ((dev->regions[5].size != 0) && (uVar7 = 5, (dev->regions[5].field_0x20 & 1) == 0)) {
    uVar7 = uVar6;
  }
  if (uVar7 != 0xffffffff) {
    ppVar3 = (pci_io_handle *)
             pci_device_open_io(dev,dev->regions[uVar7].base_addr,dev->regions[uVar7].size);
    pnVar2->iobar = ppVar3;
    pnVar2->iobarlen = dev->regions[uVar7].size;
  }
  parse_pmc_id(*pnVar2->bar0,&pnVar2->chipset);
  return pnVar2;
}

Assistant:

struct nva_card *nva_init_gpu(struct pci_device *dev) {
	struct nva_card *card = calloc(sizeof *card, 1);
	if (!card)
		return 0;
	card->type = NVA_DEVICE_GPU;
	card->bus_type = NVA_BUS_PCI;
	card->bus.pci = dev;
	int ret = pci_device_map_range(dev, dev->regions[0].base_addr, dev->regions[0].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar0);
	if (ret) {
		fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
		free(card);
		return 0;
	}
	card->bar0len = dev->regions[0].size;
	if (dev->regions[1].size) {
		card->hasbar1 = 1;
		card->bar1len = dev->regions[1].size;
		ret = pci_device_map_range(dev, dev->regions[1].base_addr, dev->regions[1].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar1);
		if (ret) {
			card->bar1 = 0;
		}
	}
	if (dev->regions[2].size && !dev->regions[2].is_IO) {
		card->hasbar2 = 1;
		card->bar2len = dev->regions[2].size;
		ret = pci_device_map_range(dev, dev->regions[2].base_addr, dev->regions[2].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar2);
		if (ret) {
			card->bar2 = 0;
		}
	} else if (dev->regions[3].size) {
		card->hasbar2 = 1;
		card->bar2len = dev->regions[3].size;
		ret = pci_device_map_range(dev, dev->regions[3].base_addr, dev->regions[3].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar2);
		if (ret) {
			card->bar2 = 0;
		}
	}
	/* ignore errors */
	pci_device_map_legacy(dev, 0, 0x100000, PCI_DEV_MAP_FLAG_WRITABLE, &card->rawmem);
	card->rawio = pci_legacy_open_io(dev, 0, 0x10000);
	int iobar = -1;
	if (dev->regions[2].size && dev->regions[2].is_IO)
		iobar = 2;
	if (dev->regions[5].size && dev->regions[5].is_IO)
		iobar = 5;
	if (iobar != -1) {
		card->iobar = pci_device_open_io(dev, dev->regions[iobar].base_addr, dev->regions[iobar].size);
		card->iobarlen = dev->regions[iobar].size;
	}
	uint32_t pmc_id = nva_grd32(card->bar0, 0);
	parse_pmc_id(pmc_id, &card->chipset);
	return card;
}